

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

void __thiscall
curlpp::FormParts::Content::add(Content *this,curl_httppost **first,curl_httppost **last)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    curl_formadd(in_RSI,in_RDX,2,uVar2,5,uVar3,0xe,uVar4,0x11);
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    curl_formadd(in_RSI,in_RDX,2,uVar2,5,uVar3,0x11);
  }
  return;
}

Assistant:

void
curlpp::FormParts::Content::add(::curl_httppost ** first, 
				::curl_httppost ** last)
{
  // We uses options that will copy internally the string (c_str),
  // so we don't need to worry about the memory.
  if(mContentType.empty()) {
    curl_formadd(first, 
		 last, 
		 CURLFORM_PTRNAME, 
		 mName.c_str(), 
		 CURLFORM_PTRCONTENTS,
		 mContent.c_str(),
		 CURLFORM_END);
  }
  else {
    curl_formadd(first, 
		 last, 
		 CURLFORM_PTRNAME, 
		 mName.c_str(), 
		 CURLFORM_PTRCONTENTS,
		 mContent.c_str(),
		 CURLFORM_CONTENTTYPE,
		 mContentType.c_str(),
		 CURLFORM_END );
  }
}